

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void __thiscall
testing::TestEventListeners::SetDefaultResultPrinter
          (TestEventListeners *this,TestEventListener *listener)

{
  long lVar1;
  TestEventListener *pTVar2;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->default_result_printer_ != listener) {
    pTVar2 = Release(this,this->default_result_printer_);
    if (pTVar2 != (TestEventListener *)0x0) {
      (*pTVar2->_vptr_TestEventListener[1])(pTVar2);
    }
    this->default_result_printer_ = listener;
    if (listener != (TestEventListener *)0x0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        Append(this,listener);
        return;
      }
      goto LAB_00151c08;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
LAB_00151c08:
  __stack_chk_fail();
}

Assistant:

void TestEventListeners::SetDefaultResultPrinter(TestEventListener* listener) {
  if (default_result_printer_ != listener) {
    // It is an error to pass this method a listener that is already in the
    // list.
    delete Release(default_result_printer_);
    default_result_printer_ = listener;
    if (listener != NULL)
      Append(listener);
  }
}